

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::PopulateIncludeDirectoriesInterface
          (cmExportFileGenerator *this,cmGeneratorTarget *target,PreprocessContext preprocessRule,
          ImportPropertyMap *properties,cmTargetExport *te,string *includesDestinationDirs)

{
  cmListFileBacktrace *this_00;
  cmValue cVar1;
  bool bVar2;
  cmake *cmakeInstance;
  pointer pcVar3;
  cmLocalGenerator *pcVar4;
  string *psVar5;
  ostream *poVar6;
  ulong uVar7;
  char *__lhs;
  mapped_type *this_01;
  cmStringRange cVar8;
  allocator<char> local_411;
  key_type local_410;
  allocator<char> local_3e9;
  string local_3e8;
  undefined1 local_3c8 [8];
  string prepro;
  char *sep;
  undefined1 local_378 [8];
  string includes;
  key_type local_350;
  undefined4 local_32c;
  string local_328;
  undefined1 local_308 [8];
  ostringstream e;
  cmLocalGenerator *lg;
  allocator<char> local_161;
  string local_160;
  undefined1 local_140 [8];
  string exportDirs;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  string local_e8;
  undefined1 local_c8 [8];
  string dirs;
  undefined1 local_98 [8];
  cmGeneratorExpression ge;
  allocator<char> local_69;
  string local_68;
  cmValue local_48;
  cmValue input;
  char *propName;
  string *includesDestinationDirs_local;
  cmTargetExport *te_local;
  ImportPropertyMap *properties_local;
  PreprocessContext preprocessRule_local;
  cmGeneratorTarget *target_local;
  cmExportFileGenerator *this_local;
  
  if (preprocessRule != InstallInterface) {
    __assert_fail("preprocessRule == cmGeneratorExpression::InstallInterface",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmExportFileGenerator.cxx"
                  ,0x189,
                  "void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(const cmGeneratorTarget *, cmGeneratorExpression::PreprocessContext, ImportPropertyMap &, const cmTargetExport &, std::string &)"
                 );
  }
  std::__cxx11::string::clear();
  input.Value = (string *)0x1157314;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"INTERFACE_INCLUDE_DIRECTORIES",&local_69);
  local_48 = cmGeneratorTarget::GetProperty(target,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  cmakeInstance = cmMakefile::GetCMakeInstance(target->Makefile);
  dirs.field_2._8_8_ = 0;
  this_00 = (cmListFileBacktrace *)((long)&dirs.field_2 + 8);
  cmListFileBacktrace::cmListFileBacktrace(this_00);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_98,cmakeInstance,this_00);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)((long)&dirs.field_2 + 8));
  cVar8 = cmTarget::GetInstallIncludeDirectoriesEntries_abi_cxx11_(target->Target,te);
  cge._M_t.
  super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
  .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
        )cVar8.Begin._M_current;
  cmList::
  to_string<cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_0>
            (&local_e8,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&cge);
  cmGeneratorExpression::Preprocess((string *)local_c8,&local_e8,InstallInterface,true);
  std::__cxx11::string::~string((string *)&local_e8);
  (*this->_vptr_cmExportFileGenerator[0x14])(this,local_c8);
  std::__cxx11::string::string((string *)(exportDirs.field_2._M_local_buf + 8),(string *)local_c8);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&stack0xffffffffffffff00,(string *)local_98)
  ;
  std::__cxx11::string::~string((string *)(exportDirs.field_2._M_local_buf + 8));
  pcVar3 = std::
           unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)&stack0xffffffffffffff00);
  pcVar4 = cmGeneratorTarget::GetLocalGenerator(target);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"",&local_161);
  std::__cxx11::string::string((string *)&lg);
  psVar5 = cmCompiledGeneratorExpression::Evaluate
                     (pcVar3,pcVar4,&local_160,target,(cmGeneratorExpressionDAGChecker *)0x0,
                      (cmGeneratorTarget *)0x0,(string *)&lg);
  std::__cxx11::string::string((string *)local_140,(string *)psVar5);
  std::__cxx11::string::~string((string *)&lg);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  pcVar3 = std::
           unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)&stack0xffffffffffffff00);
  bVar2 = cmCompiledGeneratorExpression::GetHadContextSensitiveCondition(pcVar3);
  if (bVar2) {
    pcVar4 = cmGeneratorTarget::GetLocalGenerator(target);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
    poVar6 = std::operator<<((ostream *)local_308,"Target \"");
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    poVar6 = std::operator<<(poVar6,(string *)psVar5);
    std::operator<<(poVar6,
                    "\" is installed with INCLUDES DESTINATION set to a context sensitive path.  Paths which depend on the configuration, policy values or the link interface are not supported.  Consider using target_include_directories instead."
                   );
    std::__cxx11::ostringstream::str();
    cmLocalGenerator::IssueMessage(pcVar4,FATAL_ERROR,&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    local_32c = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
    goto LAB_008ee821;
  }
  bVar2 = cmValue::operator_cast_to_bool(&local_48);
  if ((!bVar2) && (uVar7 = std::__cxx11::string::empty(), (uVar7 & 1) != 0)) {
    local_32c = 1;
    goto LAB_008ee821;
  }
  bVar2 = cmValue::operator_cast_to_bool(&local_48);
  if (bVar2) {
    cmValue::operator->[abi_cxx11_(&local_48);
    uVar7 = std::__cxx11::string::empty();
    if (((uVar7 & 1) != 0) &&
       (uVar7 = std::__cxx11::string::empty(), cVar1 = input, (uVar7 & 1) != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_350,(char *)cVar1.Value,
                 (allocator<char> *)(includes.field_2._M_local_buf + 0xf));
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](properties,&local_350);
      std::__cxx11::string::clear();
      std::__cxx11::string::~string((string *)&local_350);
      std::allocator<char>::~allocator((allocator<char> *)(includes.field_2._M_local_buf + 0xf));
      local_32c = 1;
      goto LAB_008ee821;
    }
  }
  prefixItems((string *)local_140);
  std::__cxx11::string::operator=((string *)includesDestinationDirs,(string *)local_140);
  bVar2 = cmValue::operator_cast_to_bool(&local_48);
  sep._6_1_ = 0;
  if (bVar2) {
    psVar5 = cmValue::operator*[abi_cxx11_(&local_48);
    std::__cxx11::string::string((string *)local_378,(string *)psVar5);
  }
  else {
    std::allocator<char>::allocator();
    sep._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_378,"",(allocator<char> *)((long)&sep + 7));
  }
  if ((sep._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&sep + 7));
  }
  bVar2 = cmValue::operator_cast_to_bool(&local_48);
  __lhs = "";
  if (bVar2) {
    __lhs = ";";
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&prepro.field_2 + 8),__lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
  std::__cxx11::string::operator+=((string *)local_378,(string *)(prepro.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(prepro.field_2._M_local_buf + 8));
  cmGeneratorExpression::Preprocess((string *)local_3c8,(string *)local_378,InstallInterface,true);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    ResolveTargetsInGeneratorExpressions(this,(string *)local_3c8,target,NoReplaceFreeTargets);
    cVar1 = input;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e8,(char *)cVar1.Value,&local_3e9);
    bVar2 = checkInterfaceDirs((string *)local_3c8,target,&local_3e8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator(&local_3e9);
    cVar1 = input;
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_410,(char *)cVar1.Value,&local_411);
      this_01 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](properties,&local_410);
      std::__cxx11::string::operator=((string *)this_01,(string *)local_3c8);
      std::__cxx11::string::~string((string *)&local_410);
      std::allocator<char>::~allocator(&local_411);
      goto LAB_008ee7ff;
    }
    local_32c = 1;
  }
  else {
LAB_008ee7ff:
    local_32c = 0;
  }
  std::__cxx11::string::~string((string *)local_3c8);
  std::__cxx11::string::~string((string *)local_378);
LAB_008ee821:
  std::__cxx11::string::~string((string *)local_140);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)&stack0xffffffffffffff00);
  std::__cxx11::string::~string((string *)local_c8);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_98);
  return;
}

Assistant:

void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(
  cmGeneratorTarget const* target,
  cmGeneratorExpression::PreprocessContext preprocessRule,
  ImportPropertyMap& properties, cmTargetExport const& te,
  std::string& includesDestinationDirs)
{
  assert(preprocessRule == cmGeneratorExpression::InstallInterface);

  includesDestinationDirs.clear();

  const char* propName = "INTERFACE_INCLUDE_DIRECTORIES";
  cmValue input = target->GetProperty(propName);

  cmGeneratorExpression ge(*target->Makefile->GetCMakeInstance());

  std::string dirs = cmGeneratorExpression::Preprocess(
    cmList::to_string(target->Target->GetInstallIncludeDirectoriesEntries(te)),
    preprocessRule, true);
  this->ReplaceInstallPrefix(dirs);
  std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(dirs);
  std::string exportDirs =
    cge->Evaluate(target->GetLocalGenerator(), "", target);

  if (cge->GetHadContextSensitiveCondition()) {
    cmLocalGenerator* lg = target->GetLocalGenerator();
    std::ostringstream e;
    e << "Target \"" << target->GetName()
      << "\" is installed with "
         "INCLUDES DESTINATION set to a context sensitive path.  Paths which "
         "depend on the configuration, policy values or the link interface "
         "are "
         "not supported.  Consider using target_include_directories instead.";
    lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  if (!input && exportDirs.empty()) {
    return;
  }
  if ((input && input->empty()) && exportDirs.empty()) {
    // Set to empty
    properties[propName].clear();
    return;
  }

  prefixItems(exportDirs);
  includesDestinationDirs = exportDirs;

  std::string includes = (input ? *input : "");
  const char* sep = input ? ";" : "";
  includes += sep + exportDirs;
  std::string prepro =
    cmGeneratorExpression::Preprocess(includes, preprocessRule, true);
  if (!prepro.empty()) {
    this->ResolveTargetsInGeneratorExpressions(prepro, target);

    if (!checkInterfaceDirs(prepro, target, propName)) {
      return;
    }
    properties[propName] = prepro;
  }
}